

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pUVar4;
  ulong uVar5;
  long lVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  
  if (0 < num) {
    uVar5 = (ulong)(uint)num;
    lVar6 = (long)start << 4;
    do {
      UnknownField::Delete
                ((UnknownField *)
                 ((long)&((this->fields_->
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar6));
      lVar6 = lVar6 + 0x10;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  uVar5 = (ulong)(start + num);
  pvVar7 = this->fields_;
  pUVar4 = (pvVar7->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(pvVar7->
                            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 4)) {
    lVar6 = uVar5 << 4;
    do {
      puVar1 = (undefined8 *)((long)&pUVar4->number_ + lVar6);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pUVar4[-(long)num].number_ + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      uVar5 = uVar5 + 1;
      pvVar7 = this->fields_;
      pUVar4 = (pvVar7->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < (ulong)((long)(pvVar7->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 4))
    ;
  }
  if (0 < num) {
    (pvVar7->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         (pvVar7->
         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
         )._M_impl.super__Vector_impl_data._M_finish + (-1 - (ulong)(num - 1));
  }
  if ((pvVar7->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish == pUVar4) {
    if (pUVar4 != (pointer)0x0) {
      operator_delete(pUVar4,(long)(pvVar7->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)pUVar4);
    }
    operator_delete(pvVar7,0x18);
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (*fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_->size(); ++i) {
    (*fields_)[i - num] = (*fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_->pop_back();
  }
  if (fields_ && fields_->size() == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}